

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_swap.cpp
# Opt level: O0

void __thiscall SWAP_TEST_SWAP_TWO_INT_Test::TestBody(SWAP_TEST_SWAP_TWO_INT_Test *this)

{
  int *a;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  int val2;
  int val1;
  SWAP_TEST_SWAP_TWO_INT_Test *this_local;
  
  gtest_ar.message_.ptr_._4_4_ = 10;
  gtest_ar.message_.ptr_._0_4_ = 0x14;
  a = (int *)((long)&gtest_ar.message_.ptr_ + 4);
  swap(a,(int *)&gtest_ar.message_);
  local_2c = 0x14;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_28,"20","val1",&local_2c,a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/TonsenWei[P]gtest_win/test/test_swap.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_64 = 10;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"10","val2",&local_64,(int *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/TonsenWei[P]gtest_win/test/test_swap.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST(SWAP_TEST, SWAP_TWO_INT) {
    int val1 = 10;
    int val2 = 20;
    swap(val1, val2);
    EXPECT_EQ(20, val1);
    EXPECT_EQ(10, val2);
}